

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O3

uint32_t simd_desc_arm(uint32_t oprsz,uint32_t maxsz,int32_t data)

{
  if ((0x100 < oprsz) || ((oprsz & 7) != 0)) {
    __assert_fail("oprsz % 8 == 0 && oprsz <= (8 << SIMD_OPRSZ_BITS)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
                  ,0x4f,"uint32_t simd_desc_arm(uint32_t, uint32_t, int32_t)");
  }
  if ((maxsz < 0x101) && ((maxsz & 7) == 0)) {
    if (data + 0x200000U < 0x400000) {
      return data << 10 | maxsz * 4 + 0x3e0 & 0x3e0 | (oprsz >> 3) - 1 & 0x1f;
    }
    __assert_fail("data == sextract32(data, 0, SIMD_DATA_BITS)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
                  ,0x51,"uint32_t simd_desc_arm(uint32_t, uint32_t, int32_t)");
  }
  __assert_fail("maxsz % 8 == 0 && maxsz <= (8 << SIMD_MAXSZ_BITS)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
                ,0x50,"uint32_t simd_desc_arm(uint32_t, uint32_t, int32_t)");
}

Assistant:

uint32_t simd_desc(uint32_t oprsz, uint32_t maxsz, int32_t data)
{
    uint32_t desc = 0;

    assert(oprsz % 8 == 0 && oprsz <= (8 << SIMD_OPRSZ_BITS));
    assert(maxsz % 8 == 0 && maxsz <= (8 << SIMD_MAXSZ_BITS));
    assert(data == sextract32(data, 0, SIMD_DATA_BITS));

    oprsz = (oprsz / 8) - 1;
    maxsz = (maxsz / 8) - 1;
    desc = deposit32(desc, SIMD_OPRSZ_SHIFT, SIMD_OPRSZ_BITS, oprsz);
    desc = deposit32(desc, SIMD_MAXSZ_SHIFT, SIMD_MAXSZ_BITS, maxsz);
    desc = deposit32(desc, SIMD_DATA_SHIFT, SIMD_DATA_BITS, data);

    return desc;
}